

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectbox.hpp
# Opt level: O3

int __thiscall obx::Transaction::close(Transaction *this,int __fd)

{
  OBX_txn *pOVar1;
  int in_EAX;
  int err;
  
  pOVar1 = this->cTxn_;
  this->cTxn_ = (OBX_txn *)0x0;
  err = obx_txn_close(pOVar1);
  if (err == 0) {
    return in_EAX;
  }
  internal::throwLastError(err,(char *)0x0);
}

Assistant:

void Transaction::close() { internal::checkErrOrThrow(closeNoThrow()); }